

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void bgr_555_to_bgr_888(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
                       int width,int height)

{
  uint uVar1;
  uint8_t *puVar2;
  int dst_pixel;
  uint8_t *dst_end;
  int dst_gap;
  int src_gap;
  uint8_t *dst_ptr;
  uint16_t *src_ptr;
  int y;
  int sy_local;
  int sx_local;
  int dst_pitch_local;
  void *dst_local;
  int src_pitch_local;
  void *src_local;
  
  src_ptr = (uint16_t *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  dst_ptr = (uint8_t *)((long)dst + (long)(dx * 3) + (long)(dy * dst_pitch));
  for (y = 0; y < height; y = y + 1) {
    puVar2 = dst_ptr + width * 3;
    for (; dst_ptr < puVar2; dst_ptr = dst_ptr + 3) {
      uVar1 = _al_rgb_scale_5[(int)(*src_ptr & 0x7c00) >> 10] << 0x10 |
              _al_rgb_scale_5[(int)(*src_ptr & 0x3e0) >> 5] << 8 |
              _al_rgb_scale_5[(int)(*src_ptr & 0x1f)];
      *dst_ptr = (uint8_t)_al_rgb_scale_5[(int)(*src_ptr & 0x1f)];
      dst_ptr[1] = (uint8_t)(uVar1 >> 8);
      dst_ptr[2] = (uint8_t)(uVar1 >> 0x10);
      src_ptr = src_ptr + 1;
    }
    src_ptr = src_ptr + (src_pitch / 2 - width);
    dst_ptr = dst_ptr + (dst_pitch / 1 + width * -3);
  }
  return;
}

Assistant:

static void bgr_555_to_bgr_888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 1 - width * 3;
   src_ptr += sx;
   dst_ptr += dx * 3;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width * 3;
      while (dst_ptr < dst_end) {
         int dst_pixel = ALLEGRO_CONVERT_BGR_555_TO_BGR_888(*src_ptr);
         #ifdef ALLEGRO_BIG_ENDIAN
         dst_ptr[0] = dst_pixel >> 16;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel;
         #else
         dst_ptr[0] = dst_pixel;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel >> 16;
         #endif
         src_ptr += 1;
         dst_ptr += 1 * 3;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}